

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_ObjDelay(Gia_Man_t *pNew,int iObj,int nLutSize,Vec_Int_t *vDelay)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  if ((iObj < 0) || (uVar7 = vDelay->nSize, (int)uVar7 <= iObj)) goto LAB_007e52de;
  piVar1 = vDelay->pArray;
  iVar4 = piVar1[(uint)iObj];
  if (iVar4 == 0) {
    if ((pNew->pMuxes == (uint *)0x0) || (uVar8 = pNew->pMuxes[(uint)iObj], uVar8 == 0)) {
      if (pNew->nObjs <= iObj) goto LAB_007e52fd;
      uVar8 = iObj - ((uint)*(undefined8 *)(pNew->pObjs + (uint)iObj) & 0x1fffffff);
      if (((((int)uVar8 < 0) || (uVar7 <= uVar8)) ||
          (uVar6 = iObj - ((uint)((ulong)*(undefined8 *)(pNew->pObjs + (uint)iObj) >> 0x20) &
                          0x1fffffff), (int)uVar6 < 0)) || (uVar7 <= uVar6)) goto LAB_007e52de;
      iVar4 = piVar1[uVar8] >> 4;
      iVar10 = piVar1[uVar6] >> 4;
      uVar7 = piVar1[uVar8] & 0xf;
      iVar9 = iVar10;
      if (iVar10 < iVar4) {
        iVar9 = iVar4;
      }
      if (iVar4 < iVar10) {
        uVar7 = 1;
      }
      uVar8 = piVar1[uVar6] & 0xf;
      if (iVar10 < iVar4) {
        uVar8 = 1;
      }
      iVar4 = 0x12;
      if ((int)(uVar8 + uVar7) <= nLutSize) {
        iVar4 = uVar8 + uVar7;
      }
      iVar4 = iVar4 + iVar9 * 0x10;
    }
    else {
      if (pNew->nObjs <= iObj) {
LAB_007e52fd:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar6 = iObj - ((uint)*(undefined8 *)(pNew->pObjs + (uint)iObj) & 0x1fffffff);
      if ((((int)uVar6 < 0) || (uVar7 <= uVar6)) ||
         ((uVar5 = iObj - ((uint)((ulong)*(undefined8 *)(pNew->pObjs + (uint)iObj) >> 0x20) &
                          0x1fffffff), (int)uVar5 < 0 || (uVar7 <= uVar5)))) {
LAB_007e52de:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar7 <= uVar8 >> 1) goto LAB_007e52de;
      iVar9 = piVar1[uVar6] >> 4;
      iVar10 = piVar1[uVar5] >> 4;
      iVar4 = iVar10;
      if (iVar10 < iVar9) {
        iVar4 = iVar9;
      }
      iVar3 = piVar1[uVar8 >> 1] >> 4;
      iVar2 = iVar3;
      if (iVar3 < iVar4) {
        iVar2 = iVar4;
      }
      uVar7 = piVar1[uVar6] & 0xf;
      if (iVar2 != iVar9) {
        uVar7 = 1;
      }
      uVar6 = piVar1[uVar5] & 0xf;
      if (iVar2 != iVar10) {
        uVar6 = 1;
      }
      uVar8 = piVar1[uVar8 >> 1] & 0xf;
      if (iVar3 < iVar4) {
        uVar8 = 1;
      }
      iVar9 = uVar8 + uVar6 + uVar7;
      iVar4 = 0x13;
      if (iVar9 <= nLutSize) {
        iVar4 = iVar9;
      }
      iVar4 = iVar4 + iVar2 * 0x10;
    }
    piVar1[(uint)iObj] = iVar4;
  }
  return iVar4;
}

Assistant:

static inline int Str_ObjDelay( Gia_Man_t * pNew, int iObj, int nLutSize, Vec_Int_t * vDelay )
{
    int Delay = Vec_IntEntry( vDelay, iObj );
    if ( Delay == 0 )
    {
        if ( Gia_ObjIsMuxId(pNew, iObj) )
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            int d2 = Vec_IntEntry( vDelay, Gia_ObjFaninId2(pNew, iObj) );
            Delay = Str_Delay3( d0, d1, d2, nLutSize );
        }
        else
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            Delay = Str_Delay2( d0, d1, nLutSize );
        }
        Vec_IntWriteEntry( vDelay, iObj, Delay );
    }
    return Delay;
}